

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void nonce_function_bip340_bitflip
               (uchar **args,size_t n_flip,size_t n_bytes,size_t msglen,size_t algolen)

{
  int iVar1;
  secp256k1_keypair *key32;
  secp256k1_keypair *keypair;
  void *ndata;
  size_t msglen_00;
  uchar *msg;
  secp256k1_keypair *keypair_00;
  uchar (*nonce32) [32];
  secp256k1_context *input32;
  int iVar2;
  secp256k1_keypair *xonly_pk32;
  secp256k1_keypair *psVar3;
  secp256k1_xonly_pubkey *pubkey;
  uchar *algo;
  long lVar4;
  secp256k1_xonly_pubkey sStackY_230;
  secp256k1_keypair *psStackY_1f0;
  uchar *puStackY_1e8;
  secp256k1_keypair *psStackY_1e0;
  code *pcStackY_1d8;
  secp256k1_schnorrsig_extraparams sStack_1c0;
  undefined1 auStack_1a0 [64];
  undefined1 auStack_160 [160];
  char acStack_c0 [64];
  uchar **ppuStack_80;
  uchar nonces [2] [32];
  
  nonce32 = nonces;
  msg = *args;
  key32 = (secp256k1_keypair *)args[1];
  xonly_pk32 = (secp256k1_keypair *)args[2];
  algo = args[3];
  iVar1 = nonce_function_bip340
                    (nonces[0],msg,0x20,(uchar *)key32,(uchar *)xonly_pk32,algo,0xd,args[4]);
  if (iVar1 == 0) {
    nonce_function_bip340_bitflip_cold_3();
  }
  else {
    testrand_flip(args[n_flip],n_bytes);
    nonce32 = nonces + 1;
    msg = *args;
    key32 = (secp256k1_keypair *)args[1];
    xonly_pk32 = (secp256k1_keypair *)args[2];
    algo = args[3];
    lVar4 = 0x20;
    iVar1 = nonce_function_bip340
                      (*nonce32,msg,0x20,(uchar *)key32,(uchar *)xonly_pk32,algo,0xd,args[4]);
    if (iVar1 != 0) {
      do {
        if (nonces[-1][lVar4] != nonces[0][lVar4]) {
          return;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x40);
      nonce_function_bip340_bitflip_cold_1();
      return;
    }
  }
  nonce_function_bip340_bitflip_cold_2();
  sStack_1c0.magic[0] = 0xda;
  sStack_1c0.magic[1] = 'o';
  sStack_1c0.magic[2] = 0xb3;
  sStack_1c0.magic[3] = 0x8c;
  sStack_1c0._4_4_ = 0;
  sStack_1c0.noncefp = (secp256k1_nonce_function_hardened)0x0;
  keypair_00 = (secp256k1_keypair *)(auStack_160 + 0x40);
  pcStackY_1d8 = (code *)0x15388a;
  keypair = key32;
  input32 = CTX;
  psVar3 = xonly_pk32;
  ppuStack_80 = args;
  iVar1 = secp256k1_keypair_create(CTX,keypair_00,*nonce32);
  iVar2 = (int)psVar3;
  if (iVar1 == 0) {
    pcStackY_1d8 = (code *)0x1539c4;
    test_schnorrsig_bip_vectors_check_signing_cold_9();
LAB_001539c4:
    pcStackY_1d8 = (code *)0x1539c9;
    test_schnorrsig_bip_vectors_check_signing_cold_8();
LAB_001539c9:
    pcStackY_1d8 = (code *)0x1539ce;
    test_schnorrsig_bip_vectors_check_signing_cold_6();
LAB_001539ce:
    pcStackY_1d8 = (code *)0x1539d3;
    test_schnorrsig_bip_vectors_check_signing_cold_5();
  }
  else {
    keypair_00 = (secp256k1_keypair *)auStack_1a0;
    psVar3 = (secp256k1_keypair *)(auStack_160 + 0x40);
    pcStackY_1d8 = (code *)0x1538b6;
    keypair = xonly_pk32;
    input32 = CTX;
    iVar1 = secp256k1_schnorrsig_sign_custom
                      (CTX,(uchar *)keypair_00,key32->data,(size_t)xonly_pk32,psVar3,&sStack_1c0);
    iVar2 = (int)psVar3;
    if (iVar1 == 0) goto LAB_001539c4;
    lVar4 = 0;
    do {
      keypair = (secp256k1_keypair *)CONCAT71((int7)((ulong)keypair >> 8),auStack_1a0[lVar4]);
      if (auStack_1a0[lVar4] != algo[lVar4]) goto LAB_001539dd;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x40);
    if (xonly_pk32 == (secp256k1_keypair *)0x20) {
      keypair_00 = (secp256k1_keypair *)auStack_1a0;
      auStack_1a0[0x30] = '\0';
      auStack_1a0[0x31] = '\0';
      auStack_1a0[0x32] = '\0';
      auStack_1a0[0x33] = '\0';
      auStack_1a0[0x34] = '\0';
      auStack_1a0[0x35] = '\0';
      auStack_1a0[0x36] = '\0';
      auStack_1a0[0x37] = '\0';
      auStack_1a0[0x38] = '\0';
      auStack_1a0[0x39] = '\0';
      auStack_1a0[0x3a] = '\0';
      auStack_1a0[0x3b] = '\0';
      auStack_1a0[0x3c] = '\0';
      auStack_1a0[0x3d] = '\0';
      auStack_1a0[0x3e] = '\0';
      auStack_1a0[0x3f] = '\0';
      auStack_1a0[0x20] = '\0';
      auStack_1a0[0x21] = '\0';
      auStack_1a0[0x22] = '\0';
      auStack_1a0[0x23] = '\0';
      auStack_1a0[0x24] = '\0';
      auStack_1a0[0x25] = '\0';
      auStack_1a0[0x26] = '\0';
      auStack_1a0[0x27] = '\0';
      auStack_1a0[0x28] = '\0';
      auStack_1a0[0x29] = '\0';
      auStack_1a0[0x2a] = '\0';
      auStack_1a0[0x2b] = '\0';
      auStack_1a0[0x2c] = '\0';
      auStack_1a0[0x2d] = '\0';
      auStack_1a0[0x2e] = '\0';
      auStack_1a0[0x2f] = '\0';
      auStack_1a0[0x10] = '\0';
      auStack_1a0[0x11] = '\0';
      auStack_1a0[0x12] = '\0';
      auStack_1a0[0x13] = '\0';
      auStack_1a0[0x14] = '\0';
      auStack_1a0[0x15] = '\0';
      auStack_1a0[0x16] = '\0';
      auStack_1a0[0x17] = '\0';
      auStack_1a0[0x18] = '\0';
      auStack_1a0[0x19] = '\0';
      auStack_1a0[0x1a] = '\0';
      auStack_1a0[0x1b] = '\0';
      auStack_1a0[0x1c] = '\0';
      auStack_1a0[0x1d] = '\0';
      auStack_1a0[0x1e] = '\0';
      auStack_1a0[0x1f] = '\0';
      auStack_1a0[0] = '\0';
      auStack_1a0[1] = '\0';
      auStack_1a0[2] = '\0';
      auStack_1a0[3] = '\0';
      auStack_1a0[4] = '\0';
      auStack_1a0[5] = '\0';
      auStack_1a0[6] = '\0';
      auStack_1a0[7] = '\0';
      auStack_1a0[8] = '\0';
      auStack_1a0[9] = '\0';
      auStack_1a0[10] = '\0';
      auStack_1a0[0xb] = '\0';
      auStack_1a0[0xc] = '\0';
      auStack_1a0[0xd] = '\0';
      auStack_1a0[0xe] = '\0';
      auStack_1a0[0xf] = '\0';
      psVar3 = (secp256k1_keypair *)(auStack_160 + 0x40);
      keypair = (secp256k1_keypair *)0x20;
      pcStackY_1d8 = (code *)0x15391b;
      input32 = CTX;
      iVar1 = secp256k1_schnorrsig_sign_internal
                        (CTX,(uchar *)keypair_00,key32->data,0x20,psVar3,nonce_function_bip340,ndata
                        );
      iVar2 = (int)psVar3;
      if (iVar1 == 0) goto LAB_001539d8;
      lVar4 = 0;
      do {
        keypair = (secp256k1_keypair *)CONCAT71((int7)((ulong)keypair >> 8),auStack_1a0[lVar4]);
        if (auStack_1a0[lVar4] != algo[lVar4]) goto LAB_001539e7;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x40);
    }
    keypair_00 = (secp256k1_keypair *)acStack_c0;
    pcStackY_1d8 = (code *)0x153953;
    input32 = CTX;
    iVar1 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)keypair_00,msg);
    if (iVar1 == 0) goto LAB_001539c9;
    keypair_00 = (secp256k1_keypair *)auStack_160;
    keypair = (secp256k1_keypair *)(auStack_160 + 0x40);
    pcStackY_1d8 = (code *)0x153972;
    input32 = CTX;
    iVar1 = secp256k1_keypair_xonly_pub(CTX,(secp256k1_xonly_pubkey *)keypair_00,(int *)0x0,keypair)
    ;
    if (iVar1 == 0) goto LAB_001539ce;
    lVar4 = 0;
    do {
      keypair = (secp256k1_keypair *)CONCAT71((int7)((ulong)keypair >> 8),auStack_160[lVar4]);
      if (auStack_160[lVar4] != acStack_c0[lVar4]) goto LAB_001539e2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x40);
    keypair_00 = (secp256k1_keypair *)auStack_1a0;
    pubkey = (secp256k1_xonly_pubkey *)auStack_160;
    pcStackY_1d8 = (code *)0x1539aa;
    keypair = xonly_pk32;
    input32 = CTX;
    iVar1 = secp256k1_schnorrsig_verify
                      (CTX,(uchar *)keypair_00,key32->data,(size_t)xonly_pk32,pubkey);
    iVar2 = (int)pubkey;
    if (iVar1 != 0) {
      return;
    }
  }
  pcStackY_1d8 = (code *)0x1539d8;
  test_schnorrsig_bip_vectors_check_signing_cold_4();
LAB_001539d8:
  pcStackY_1d8 = (code *)0x1539dd;
  test_schnorrsig_bip_vectors_check_signing_cold_7();
LAB_001539dd:
  pcStackY_1d8 = (code *)0x1539e2;
  test_schnorrsig_bip_vectors_check_signing_cold_1();
LAB_001539e2:
  pcStackY_1d8 = (code *)0x1539e7;
  test_schnorrsig_bip_vectors_check_signing_cold_3();
LAB_001539e7:
  pcStackY_1d8 = test_schnorrsig_bip_vectors_check_verify;
  test_schnorrsig_bip_vectors_check_signing_cold_2();
  psStackY_1f0 = xonly_pk32;
  puStackY_1e8 = algo;
  psStackY_1e0 = key32;
  pcStackY_1d8 = (code *)msg;
  iVar1 = secp256k1_xonly_pubkey_parse(CTX,&sStackY_230,(uchar *)input32);
  if (iVar1 == 0) {
    test_schnorrsig_bip_vectors_check_verify_cold_2();
  }
  else {
    iVar1 = secp256k1_schnorrsig_verify(CTX,keypair->data,keypair_00->data,msglen_00,&sStackY_230);
    if (iVar1 == iVar2) {
      return;
    }
  }
  test_schnorrsig_bip_vectors_check_verify_cold_1();
  return;
}

Assistant:

static void nonce_function_bip340_bitflip(unsigned char **args, size_t n_flip, size_t n_bytes, size_t msglen, size_t algolen) {
    unsigned char nonces[2][32];
    CHECK(nonce_function_bip340(nonces[0], args[0], msglen, args[1], args[2], args[3], algolen, args[4]) == 1);
    testrand_flip(args[n_flip], n_bytes);
    CHECK(nonce_function_bip340(nonces[1], args[0], msglen, args[1], args[2], args[3], algolen, args[4]) == 1);
    CHECK(secp256k1_memcmp_var(nonces[0], nonces[1], 32) != 0);
}